

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O1

bool __thiscall BuildLog::Recompact(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  char *pcVar4;
  Metrics *this_00;
  char cVar5;
  int iVar6;
  FILE *__stream;
  int *piVar7;
  char *pcVar8;
  Metric *pMVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  vector<StringPiece,_std::allocator<StringPiece>_> dead_outputs;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  StringPiece *local_98;
  iterator iStack_90;
  StringPiece *local_88;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  ScopedMetric local_40;
  
  if ((Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)::
       metrics_h_metric == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar6 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar9 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".ninja_log recompact","")
      ;
      pMVar9 = Metrics::NewMetric(this_00,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    Recompact::metrics_h_metric = pMVar9;
    __cxa_guard_release(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,Recompact::metrics_h_metric);
  Close(this);
  local_80[0] = local_70;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_80);
  __stream = fopen((char *)local_80[0],"wb");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    pcVar4 = (char *)err->_M_string_length;
    strlen(pcVar8);
    bVar12 = false;
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar4,(ulong)pcVar8);
    goto LAB_00105882;
  }
  iVar6 = fprintf(__stream,"# ninja log v%d\n",5);
  if (iVar6 < 0) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    pcVar4 = (char *)err->_M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar4,(ulong)pcVar8);
    fclose(__stream);
    bVar12 = false;
    goto LAB_00105882;
  }
  local_98 = (StringPiece *)0x0;
  iStack_90._M_current = (StringPiece *)0x0;
  local_88 = (StringPiece *)0x0;
  for (p_Var2 = (this->entries_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    cVar5 = (*(code *)**(undefined8 **)user)(user,p_Var2[1]._M_nxt,p_Var2[2]._M_nxt);
    if (cVar5 == '\0') {
      p_Var3 = p_Var2[3]._M_nxt;
      iVar6 = fprintf(__stream,"%d\t%d\t%ld\t%s\t%lx\n",(ulong)*(uint *)&p_Var3[5]._M_nxt,
                      (ulong)*(uint *)((long)&p_Var3[5]._M_nxt + 4),p_Var3[6]._M_nxt,p_Var3->_M_nxt,
                      p_Var3[4]._M_nxt);
      if (iVar6 < 1) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        pcVar4 = (char *)err->_M_string_length;
        strlen(pcVar8);
        std::__cxx11::string::_M_replace((ulong)err,0,pcVar4,(ulong)pcVar8);
        fclose(__stream);
        bVar12 = false;
        goto LAB_0010586b;
      }
    }
    else if (iStack_90._M_current == local_88) {
      std::vector<StringPiece,std::allocator<StringPiece>>::_M_realloc_insert<StringPiece_const&>
                ((vector<StringPiece,std::allocator<StringPiece>> *)&local_98,iStack_90,
                 (StringPiece *)(p_Var2 + 1));
    }
    else {
      p_Var3 = p_Var2[2]._M_nxt;
      (iStack_90._M_current)->str_ = ((StringPiece *)(p_Var2 + 1))->str_;
      (iStack_90._M_current)->len_ = (size_t)p_Var3;
      iStack_90._M_current = iStack_90._M_current + 1;
    }
  }
  if (iStack_90._M_current != local_98) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      std::
      _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,(long)&local_98->str_ + lVar10);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < (ulong)((long)iStack_90._M_current - (long)local_98 >> 4));
  }
  fclose(__stream);
  iVar6 = unlink((path->_M_dataplus)._M_p);
  if (iVar6 < 0) {
LAB_00105772:
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    pcVar4 = (char *)err->_M_string_length;
    strlen(pcVar8);
    bVar12 = false;
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar4,(ulong)pcVar8);
  }
  else {
    iVar6 = rename((char *)local_80[0],(path->_M_dataplus)._M_p);
    bVar12 = true;
    if (iVar6 < 0) goto LAB_00105772;
  }
LAB_0010586b:
  if (local_98 != (StringPiece *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
LAB_00105882:
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar12;
}

Assistant:

bool BuildLog::Recompact(const string& path, const BuildLogUser& user,
                         string* err) {
  METRIC_RECORD(".ninja_log recompact");

  Close();
  string temp_path = path + ".recompact";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }

  vector<StringPiece> dead_outputs;
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    if (user.IsPathDead(i->first)) {
      dead_outputs.push_back(i->first);
      continue;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  for (size_t i = 0; i < dead_outputs.size(); ++i)
    entries_.erase(dead_outputs[i]);

  fclose(f);
  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}